

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefParamAssignmentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefParamAssignmentSyntax,slang::syntax::DefParamAssignmentSyntax_const&>
          (BumpAllocator *this,DefParamAssignmentSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  NameSyntax *pNVar3;
  undefined4 uVar4;
  DefParamAssignmentSyntax *pDVar5;
  
  pDVar5 = (DefParamAssignmentSyntax *)allocate(this,0x28,8);
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  pNVar3 = (args->name).ptr;
  (pDVar5->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pDVar5->super_SyntaxNode).field_0x4 = uVar4;
  (pDVar5->super_SyntaxNode).parent = pSVar1;
  (pDVar5->super_SyntaxNode).previewNode = pSVar2;
  (pDVar5->name).ptr = pNVar3;
  (pDVar5->setter).ptr = (args->setter).ptr;
  return pDVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }